

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2d65b::CleanTestCleanRuleGenerator::Run(CleanTestCleanRuleGenerator *this)

{
  Test *pTVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [8];
  Cleaner cleaner;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  CleanTestCleanRuleGenerator *pCStack_10;
  int fail_count;
  CleanTestCleanRuleGenerator *this_local;
  
  pCStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
              "rule regen\n  command = cat $in > $out\n  generator = 1\nbuild out1: cat in1\nbuild out2: regen in2\n"
              ,local_1c);
  iVar3 = local_14;
  iVar2 = testing::Test::AssertionFailures(g_current_test);
  if (iVar3 == iVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out1",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"out2",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"",(allocator<char> *)&cleaner.field_0x97);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&cleaner.field_0x97);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    Cleaner::Cleaner((Cleaner *)local_168,
                     &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
                     &(this->super_CleanTest).config_,
                     &(this->super_CleanTest).fs_.super_DiskInterface);
    pTVar1 = g_current_test;
    iVar3 = Cleaner::CleanAll((Cleaner *)local_168,false);
    testing::Test::Check
              (pTVar1,iVar3 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xf3,"0 == cleaner.CleanAll()");
    pTVar1 = g_current_test;
    iVar3 = Cleaner::cleaned_files_count((Cleaner *)local_168);
    testing::Test::Check
              (pTVar1,iVar3 == 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xf4,"1 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_CleanTest).fs_.files_removed_);
    testing::Test::Check
              (pTVar1,sVar4 == 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xf5,"1u == fs_.files_removed_.size()");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"out1",&local_189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_188,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    pTVar1 = g_current_test;
    iVar3 = Cleaner::CleanAll((Cleaner *)local_168,true);
    testing::Test::Check
              (pTVar1,iVar3 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xf9,"0 == cleaner.CleanAll( true)");
    pTVar1 = g_current_test;
    iVar3 = Cleaner::cleaned_files_count((Cleaner *)local_168);
    testing::Test::Check
              (pTVar1,iVar3 == 2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xfa,"2 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_CleanTest).fs_.files_removed_);
    testing::Test::Check
              (pTVar1,sVar4 == 2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
               ,0xfb,"2u == fs_.files_removed_.size()");
    Cleaner::~Cleaner((Cleaner *)local_168);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanRuleGenerator) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule regen\n"
"  command = cat $in > $out\n"
"  generator = 1\n"
"build out1: cat in1\n"
"build out2: regen in2\n"));
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(1, cleaner.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());

  fs_.Create("out1", "");

  EXPECT_EQ(0, cleaner.CleanAll(/*generator=*/true));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());
}